

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void QMetaObject::activate(QObject *sender,QMetaObject *m,int local_signal_index,void **argv)

{
  Type pQVar1;
  QMetaObject *in_RCX;
  int signal_index;
  void **in_stack_00000148;
  int in_stack_00000154;
  QObject *in_stack_00000158;
  
  QMetaObjectPrivate::signalOffset(in_RCX);
  pQVar1 = QBasicAtomicPointer<QSignalSpyCallbackSet>::loadRelaxed
                     ((QBasicAtomicPointer<QSignalSpyCallbackSet> *)0x3f78c3);
  if (pQVar1 == (Type)0x0) {
    doActivate<false>(in_stack_00000158,in_stack_00000154,in_stack_00000148);
  }
  else {
    doActivate<true>(in_stack_00000158,in_stack_00000154,in_stack_00000148);
  }
  return;
}

Assistant:

void QMetaObject::activate(QObject *sender, const QMetaObject *m, int local_signal_index,
                           void **argv)
{
    int signal_index = local_signal_index + QMetaObjectPrivate::signalOffset(m);

    if (Q_UNLIKELY(qt_signal_spy_callback_set.loadRelaxed()))
        doActivate<true>(sender, signal_index, argv);
    else
        doActivate<false>(sender, signal_index, argv);
}